

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

iterator cmList::Insert(container_type *container,const_iterator pos,string *value,
                       ExpandElements expandElements,EmptyElements emptyElements)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  container_type *pcVar4;
  long lVar5;
  iterator iVar6;
  pointer pbVar7;
  byte *pbVar8;
  const_iterator __position;
  byte *pbVar9;
  pointer pbVar10;
  int iVar11;
  string newValue;
  value_type local_68;
  container_type *local_48;
  pointer local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pbVar7 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = pbVar7;
  if (expandElements == Yes) {
    if ((emptyElements == No) && (value->_M_string_length == 0)) {
      return (iterator)pos._M_current;
    }
    lVar5 = std::__cxx11::string::find((char)value,0x3b);
    if (lVar5 == -1) {
LAB_002be2f8:
      iVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_insert_rval(container,pos,value);
      return (iterator)iVar6._M_current;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    pbVar8 = (byte *)(value->_M_dataplus)._M_p;
    pbVar2 = pbVar8 + value->_M_string_length;
    iVar11 = 0;
    __position._M_current = pos._M_current;
    pbVar9 = pbVar8;
    local_48 = container;
    if (value->_M_string_length != 0) {
      do {
        local_40 = pbVar7;
        bVar3 = *pbVar9;
        if (bVar3 < 0x5c) {
          if (bVar3 == 0x3b) {
            if (iVar11 == 0) {
              std::__cxx11::string::replace
                        ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)pbVar8);
              pbVar8 = pbVar9 + 1;
              iVar11 = 0;
              if ((emptyElements == Yes) || (local_68._M_string_length != 0)) {
                iVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert(local_48,__position,&local_68);
                __position._M_current = iVar6._M_current + 1;
                local_68._M_string_length = 0;
                *local_68._M_dataplus._M_p = '\0';
              }
            }
          }
          else if (bVar3 == 0x5b) {
            iVar11 = iVar11 + 1;
          }
        }
        else if (bVar3 == 0x5d) {
          iVar11 = iVar11 + -1;
        }
        else if (((bVar3 == 0x5c) && (pbVar1 = pbVar9 + 1, pbVar1 != pbVar2)) && (*pbVar1 == 0x3b))
        {
          local_38 = __position._M_current;
          std::__cxx11::string::replace
                    ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)pbVar8);
          pbVar8 = pbVar1;
          __position._M_current = local_38;
          pbVar9 = pbVar1;
        }
        pbVar9 = pbVar9 + 1;
        pbVar10 = local_40;
        pbVar7 = local_40;
      } while (pbVar9 != pbVar2);
    }
    std::__cxx11::string::replace
              ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)pbVar8);
    pcVar4 = local_48;
    if ((emptyElements == Yes) || (local_68._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(local_48,__position,&local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    pbVar7 = (pcVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  else if ((emptyElements == Yes) || (value->_M_string_length != 0)) goto LAB_002be2f8;
  return (iterator)(pos._M_current + ((long)pbVar7 - (long)pbVar10));
}

Assistant:

cmList::container_type::iterator cmList::Insert(
  container_type& container, container_type::const_iterator pos,
  std::string&& value, ExpandElements expandElements,
  EmptyElements emptyElements)
{
  auto delta = std::distance(container.cbegin(), pos);
  auto insertPos = container.begin() + delta;

  if (expandElements == ExpandElements::Yes) {
    // If argument is empty, it is an empty list.
    if (emptyElements == EmptyElements::No && value.empty()) {
      return insertPos;
    }

    // if there are no ; in the name then just copy the current string
    if (value.find(';') == std::string::npos) {
      return container.insert(insertPos, std::move(value));
    }

    std::string newValue;
    // Break the string at non-escaped semicolons not nested in [].
    int squareNesting = 0;
    auto last = value.begin();
    auto const cend = value.end();
    for (auto c = last; c != cend; ++c) {
      switch (*c) {
        case '\\': {
          // We only want to allow escaping of semicolons.  Other
          // escapes should not be processed here.
          auto cnext = c + 1;
          if ((cnext != cend) && *cnext == ';') {
            newValue.append(last, c);
            // Skip over the escape character
            last = cnext;
            c = cnext;
          }
        } break;
        case '[': {
          ++squareNesting;
        } break;
        case ']': {
          --squareNesting;
        } break;
        case ';': {
          // brackets.
          if (squareNesting == 0) {
            newValue.append(last, c);
            // Skip over the semicolon
            last = c + 1;
            if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
              // Add the last argument.
              insertPos = container.insert(insertPos, newValue);
              insertPos++;
              newValue.clear();
            }
          }
        } break;
        default: {
          // Just append this character.
        } break;
      }
    }
    newValue.append(last, cend);
    if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
      // Add the last argument.
      container.insert(insertPos, std::move(newValue));
    }
  } else if (!value.empty() || emptyElements == EmptyElements::Yes) {
    return container.insert(insertPos, std::move(value));
  }
  return container.begin() + delta;
}